

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O3

int X509v3_get_ext_by_critical(stack_st_X509_EXTENSION *x,int crit,int lastpos)

{
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  size_t i;
  
  if (x == (stack_st_X509_EXTENSION *)0x0) {
LAB_0021a75d:
    lastpos = -1;
  }
  else {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)x);
    if (lastpos < 0) {
      lastpos = -1;
    }
    i = (size_t)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar1 <= (long)i) goto LAB_0021a75d;
      pvVar2 = OPENSSL_sk_value((OPENSSL_STACK *)x,i);
      bVar3 = false;
      if (pvVar2 != (void *)0x0) {
        bVar3 = 0 < *(int *)((long)pvVar2 + 8);
      }
      lastpos = lastpos + 1;
    } while (bVar3 != (crit != 0));
  }
  return lastpos;
}

Assistant:

int X509v3_get_ext_by_critical(const STACK_OF(X509_EXTENSION) *sk, int crit,
                               int lastpos) {
  if (sk == NULL) {
    return -1;
  }

  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }

  crit = !!crit;
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (X509_EXTENSION_get_critical(ex) == crit) {
      return lastpos;
    }
  }
  return -1;
}